

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::DeadBranchElimPass::Process(DeadBranchElimPass *this)

{
  IRContext *this_00;
  Module *pMVar1;
  Instruction *ai;
  Instruction *pIVar2;
  Status SVar3;
  bool bVar4;
  ProcessFunction pfn;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  pMVar1 = (this_00->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar2 = *(Instruction **)
            ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  do {
    bVar4 = pIVar2 == (Instruction *)
                      ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction>
                      + 8U);
    if (bVar4) {
LAB_005566fd:
      local_38._8_8_ = 0;
      pcStack_20 = std::
                   _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:479:25)>
                   ::_M_invoke;
      local_28 = std::
                 _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:479:25)>
                 ::_M_manager;
      local_38._M_unused._M_object = this;
      bVar4 = IRContext::ProcessReachableCallTree(this_00,(ProcessFunction *)&local_38);
      SVar3 = SuccessWithoutChange;
      if (bVar4) {
        FixBlockOrder(this);
        SVar3 = SuccessWithChange;
      }
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
      return SVar3;
    }
    if (pIVar2->opcode_ == OpGroupDecorate) {
      if (!bVar4) {
        return SuccessWithoutChange;
      }
      goto LAB_005566fd;
    }
    pIVar2 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

Pass::Status DeadBranchElimPass::Process() {
  // Do not process if module contains OpGroupDecorate. Additional
  // support required in KillNamesAndDecorates().
  // TODO(greg-lunarg): Add support for OpGroupDecorate
  for (auto& ai : get_module()->annotations())
    if (ai.opcode() == spv::Op::OpGroupDecorate)
      return Status::SuccessWithoutChange;
  // Process all entry point functions
  ProcessFunction pfn = [this](Function* fp) {
    return EliminateDeadBranches(fp);
  };
  bool modified = context()->ProcessReachableCallTree(pfn);
  if (modified) FixBlockOrder();
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}